

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_ptr_field.h
# Opt level: O1

Value<google::protobuf::internal::GenericTypeHandler<proto2_unittest_import::ImportMessageLite>_> *
__thiscall
google::protobuf::internal::RepeatedPtrFieldBase::
Mutable<google::protobuf::internal::GenericTypeHandler<proto2_unittest_import::ImportMessageLite>>
          (RepeatedPtrFieldBase *this,int index)

{
  void **ppvVar1;
  Nonnull<const_char_*> pcVar2;
  
  if (index < 0) {
    pcVar2 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                       ((long)index,0,"index >= 0");
  }
  else {
    pcVar2 = (Nonnull<const_char_*>)0x0;
  }
  if (pcVar2 == (Nonnull<const_char_*>)0x0) {
    if (index < this->current_size_) {
      pcVar2 = (Nonnull<const_char_*>)0x0;
    }
    else {
      pcVar2 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                         ((long)index,(long)this->current_size_,"index < current_size_");
    }
    if (pcVar2 == (Nonnull<const_char_*>)0x0) {
      ppvVar1 = element_at(this,index);
      return (Value<google::protobuf::internal::GenericTypeHandler<proto2_unittest_import::ImportMessageLite>_>
              *)*ppvVar1;
    }
  }
  else {
    Mutable<google::protobuf::internal::GenericTypeHandler<proto2_unittest_import::ImportMessageLite>>
              ();
  }
  Mutable<google::protobuf::internal::GenericTypeHandler<proto2_unittest_import::ImportMessageLite>>
            ();
}

Assistant:

Value<TypeHandler>* Mutable(int index) {
    if constexpr (GetBoundsCheckMode() == BoundsCheckMode::kAbort) {
      RuntimeAssertInBounds(index, current_size_);
    } else {
      ABSL_DCHECK_GE(index, 0);
      ABSL_DCHECK_LT(index, current_size_);
    }
    return cast<TypeHandler>(element_at(index));
  }